

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VXPrintf(StrAccum *pAccum,int useExtended,char *fmt,__va_list_tag *ap)

{
  double dVar1;
  char cVar2;
  byte bVar3;
  char *pcVar4;
  bool bVar5;
  double dVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  double dVar10;
  uint uVar11;
  uint uVar12;
  undefined8 *puVar13;
  ulong uVar14;
  uint uVar15;
  ulong *puVar16;
  long lVar17;
  byte bVar18;
  int iVar19;
  double *pdVar20;
  long *plVar21;
  uint *puVar22;
  long lVar23;
  byte *pbVar24;
  ulong uVar25;
  ulong uVar26;
  byte *pbVar27;
  int iVar28;
  uint uVar29;
  int *piVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  int iVar35;
  byte *pbVar36;
  char *pcVar37;
  byte *pbVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  double dVar42;
  double y;
  char buf [70];
  byte *local_120;
  byte *local_100;
  byte local_f8;
  byte local_78;
  undefined1 local_77 [71];
  
  local_120 = (byte *)0x0;
LAB_00147d61:
  pbVar24 = (byte *)fmt;
  if (*fmt != 0x25) {
    if (*fmt == 0) {
      return;
    }
    for (lVar23 = 1; (bVar18 = ((byte *)fmt)[lVar23], bVar18 != 0 && (bVar18 != 0x25));
        lVar23 = lVar23 + 1) {
    }
    sqlite3StrAccumAppend(pAccum,fmt,(int)lVar23);
    if (bVar18 == 0) {
      return;
    }
    pbVar24 = (byte *)fmt + lVar23;
    local_120 = (byte *)fmt;
  }
  bVar18 = pbVar24[1];
  if (bVar18 == 0) {
    sqlite3StrAccumAppend(pAccum,"%",1);
    return;
  }
  bVar9 = false;
  local_f8 = 0;
  bVar7 = false;
  bVar40 = false;
  bVar39 = false;
  bVar8 = false;
  pbVar24 = pbVar24 + 2;
LAB_00147de8:
  pbVar38 = pbVar24;
  switch(bVar18) {
  case 0x20:
    bVar40 = true;
    break;
  case 0x21:
    local_f8 = 1;
    break;
  default:
    iVar19 = (int)(char)bVar18;
    pbVar38 = pbVar38 + -1;
    uVar33 = 0;
    if (iVar19 - 0x30U < 10) {
      uVar33 = 0;
      do {
        uVar33 = (iVar19 + uVar33 * 10) - 0x30;
        iVar19 = (int)(char)pbVar38[1];
        pbVar38 = pbVar38 + 1;
      } while (iVar19 - 0x30U < 10);
    }
    goto LAB_00147f72;
  case 0x23:
    bVar7 = true;
    break;
  case 0x2a:
    uVar31 = ap->gp_offset;
    if ((ulong)uVar31 < 0x29) {
      puVar22 = (uint *)((ulong)uVar31 + (long)ap->reg_save_area);
      ap->gp_offset = uVar31 + 8;
    }
    else {
      puVar22 = (uint *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar22 + 2;
    }
    uVar31 = *puVar22;
    if ((int)uVar31 < 0) {
      bVar8 = true;
    }
    uVar33 = -uVar31;
    if (0 < (int)uVar31) {
      uVar33 = uVar31;
    }
    iVar19 = (int)(char)*pbVar38;
LAB_00147f72:
    uVar25 = 0xffffffff;
    if (iVar19 == 0x2e) {
      pbVar24 = pbVar38 + 1;
      iVar19 = (int)(char)*pbVar24;
      if (iVar19 == 0x2a) {
        uVar31 = ap->gp_offset;
        if ((ulong)uVar31 < 0x29) {
          puVar22 = (uint *)((ulong)uVar31 + (long)ap->reg_save_area);
          ap->gp_offset = uVar31 + 8;
        }
        else {
          puVar22 = (uint *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar22 + 2;
        }
        uVar31 = *puVar22;
        uVar12 = -uVar31;
        if (0 < (int)uVar31) {
          uVar12 = uVar31;
        }
        uVar25 = (ulong)uVar12;
        iVar19 = (int)(char)pbVar38[2];
        pbVar38 = pbVar38 + 2;
      }
      else {
        pbVar38 = pbVar38 + 1;
        uVar25 = 0;
        if ((byte)(*pbVar24 - 0x30) < 10) {
          uVar25 = 0;
          do {
            uVar25 = (ulong)((iVar19 + (int)uVar25 * 10) - 0x30);
            pbVar24 = pbVar38 + 1;
            iVar19 = (int)(char)*pbVar24;
            pbVar38 = pbVar38 + 1;
          } while ((byte)(*pbVar24 - 0x30) < 10);
        }
      }
    }
    if (iVar19 == 0x6c) {
      iVar19 = (int)(char)pbVar38[1];
      if (iVar19 == 0x6c) {
        iVar19 = (int)(char)pbVar38[2];
        pbVar38 = pbVar38 + 2;
        bVar5 = true;
        bVar41 = false;
      }
      else {
        pbVar38 = pbVar38 + 1;
        bVar5 = true;
        bVar41 = true;
      }
    }
    else {
      bVar41 = true;
      bVar5 = false;
    }
    goto LAB_00147e45;
  case 0x2b:
    bVar39 = true;
    break;
  case 0x2d:
    bVar8 = true;
    break;
  case 0x30:
    bVar9 = true;
  }
  bVar18 = *pbVar38;
  pbVar24 = pbVar38 + 1;
  if (bVar18 == 0) goto code_r0x00147e24;
  goto LAB_00147de8;
code_r0x00147e24:
  bVar41 = true;
  bVar5 = false;
  uVar25 = 0xffffffff;
  uVar33 = 0;
  iVar19 = 0;
LAB_00147e45:
  uVar31 = (uint)uVar25;
  lVar23 = 5;
  while (iVar19 != *(char *)((long)aHardLimit + lVar23 + 0x2b)) {
    lVar23 = lVar23 + 6;
    if (lVar23 == 0x8f) {
      return;
    }
  }
  if ((useExtended == 0) && (((&UNK_001a7d3d)[lVar23] & 2) != 0)) {
    return;
  }
  cVar2 = (&UNK_001a7d3e)[lVar23];
  switch(cVar2) {
  case '\x01':
  case '\x10':
    if (((&UNK_001a7d3d)[lVar23] & 1) != 0) {
      if (!bVar41) goto LAB_00148342;
      uVar12 = ap->gp_offset;
      if (bVar5) {
        if (uVar12 < 0x29) {
          puVar16 = (ulong *)((ulong)uVar12 + (long)ap->reg_save_area);
          ap->gp_offset = uVar12 + 8;
        }
        else {
          puVar16 = (ulong *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar16 + 1;
        }
        uVar25 = *puVar16;
      }
      else {
        if (uVar12 < 0x29) {
          piVar30 = (int *)((ulong)uVar12 + (long)ap->reg_save_area);
          ap->gp_offset = uVar12 + 8;
        }
        else {
          piVar30 = (int *)ap->overflow_arg_area;
          ap->overflow_arg_area = piVar30 + 2;
        }
        uVar25 = (ulong)*piVar30;
      }
      goto LAB_001489bc;
    }
    if (!bVar41) goto LAB_00148298;
    uVar12 = ap->gp_offset;
    if (bVar5) {
      if (uVar12 < 0x29) {
        puVar16 = (ulong *)((ulong)uVar12 + (long)ap->reg_save_area);
        ap->gp_offset = uVar12 + 8;
      }
      else {
        puVar16 = (ulong *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar16 + 1;
      }
      uVar25 = *puVar16;
    }
    else {
      if (uVar12 < 0x29) {
        puVar22 = (uint *)((ulong)uVar12 + (long)ap->reg_save_area);
        ap->gp_offset = uVar12 + 8;
      }
      else {
        puVar22 = (uint *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar22 + 2;
      }
      uVar25 = (ulong)*puVar22;
    }
LAB_001489a9:
    bVar18 = 0;
    break;
  case '\x02':
  case '\x03':
  case '\x04':
    uVar12 = ap->fp_offset;
    if ((ulong)uVar12 < 0xa1) {
      pdVar20 = (double *)((ulong)uVar12 + (long)ap->reg_save_area);
      ap->fp_offset = uVar12 + 0x10;
    }
    else {
      pdVar20 = (double *)ap->overflow_arg_area;
      ap->overflow_arg_area = pdVar20 + 1;
    }
    dVar1 = *pdVar20;
    if ((int)uVar31 < 0) {
      uVar31 = 6;
    }
    if (0.0 <= dVar1) {
      if (bVar39) {
        bVar18 = 0x2b;
        uVar25 = 1;
        bVar40 = false;
        local_120 = (byte *)0x1aab04;
      }
      else {
        bVar40 = !bVar40;
        uVar25 = (ulong)!bVar40;
        bVar18 = !bVar40 << 5;
        local_120 = (byte *)0x1aab05;
      }
    }
    else {
      dVar1 = -dVar1;
      bVar18 = 0x2d;
      uVar25 = 1;
      bVar40 = false;
      local_120 = (byte *)0x1aaaff;
    }
    uVar12 = (uint)(0 < (int)uVar31 && cVar2 == '\x04');
    iVar19 = uVar31 - uVar12;
    dVar42 = 0.5;
    if (0 < iVar19) {
      uVar31 = (uVar31 - uVar12) + 1;
      dVar42 = 0.5;
      do {
        dVar42 = dVar42 * 0.1;
        uVar31 = uVar31 - 1;
      } while (1 < uVar31);
    }
    if (cVar2 == '\x02') {
      dVar1 = dVar1 + dVar42;
    }
    if (!NAN(dVar1)) {
      uVar31 = 0;
      if (0.0 < dVar1) {
        uVar15 = 0xffffff9c;
        uVar31 = 0xffffffc0;
        uVar12 = 0xfffffff8;
        uVar29 = 0xffffffff;
        dVar6 = 1.0;
        do {
          uVar34 = uVar29;
          uVar32 = uVar12;
          uVar11 = uVar31;
          dVar10 = dVar6;
          if (dVar1 < dVar6 * 1e+100) break;
          uVar15 = uVar15 + 100;
          uVar31 = uVar11 + 100;
          uVar12 = uVar32 + 100;
          uVar29 = uVar34 + 100;
          dVar6 = dVar6 * 1e+100;
        } while (uVar15 < 0x15f);
        do {
          dVar6 = dVar10;
          uVar29 = uVar34;
          uVar12 = uVar32;
          if (dVar1 < dVar6 * 1e+64) break;
          uVar11 = uVar11 + 0x40;
          uVar32 = uVar12 + 0x40;
          uVar34 = uVar29 + 0x40;
          dVar10 = dVar6 * 1e+64;
        } while (uVar11 < 0x15f);
        do {
          uVar31 = uVar29;
          dVar10 = dVar6;
          if (dVar1 < dVar6 * 100000000.0) break;
          uVar12 = uVar12 + 8;
          uVar29 = uVar31 + 8;
          dVar6 = dVar6 * 100000000.0;
        } while (uVar12 < 0x15f);
        do {
          dVar6 = dVar10;
          uVar31 = uVar31 + 1;
          dVar10 = dVar6 * 10.0;
          if (dVar1 < dVar10) break;
        } while (uVar31 < 0x15f);
        for (dVar1 = dVar1 / dVar6; dVar1 < 1e-08; dVar1 = dVar1 * 100000000.0) {
          uVar31 = uVar31 - 8;
        }
        for (; dVar1 < 1.0; dVar1 = dVar1 * 10.0) {
          uVar31 = uVar31 - 1;
        }
        if (0x15e < (int)uVar31) {
          lVar23 = 0;
          do {
            pbVar24 = local_120 + lVar23;
            lVar23 = lVar23 + 1;
          } while (*pbVar24 != 0);
          local_100 = (byte *)0x0;
          uVar31 = (int)lVar23 - 1U & 0x3fffffff;
          goto LAB_00148d65;
        }
      }
      if (cVar2 == '\x02') {
LAB_0014865e:
        bVar41 = local_f8 != 0;
        bVar39 = cVar2 == '\x03';
        uVar12 = uVar31;
        if (bVar39) {
          uVar12 = 0;
        }
      }
      else {
        dVar42 = dVar1 + dVar42;
        dVar1 = dVar42;
        if (dVar42 >= 10.0) {
          dVar1 = dVar42 * 0.1;
        }
        uVar31 = (uVar31 + 1) - (uint)(dVar42 < 10.0);
        if (cVar2 != '\x04') goto LAB_0014865e;
        bVar41 = !bVar7;
        bVar39 = iVar19 < (int)uVar31 || (int)uVar31 < -4;
        uVar12 = uVar31;
        if (iVar19 < (int)uVar31 || (int)uVar31 < -4) {
          uVar12 = 0;
        }
        iVar19 = iVar19 - uVar12;
      }
      iVar35 = uVar33 + iVar19 + uVar12;
      if (iVar35 < 0x38) {
        local_100 = (byte *)0x0;
        local_120 = &local_78;
      }
      else {
        local_120 = (byte *)sqlite3Malloc(iVar35 + 0xf);
        local_100 = local_120;
        if (local_120 == (byte *)0x0) {
LAB_00148e5f:
          pAccum->mallocFailed = '\x01';
switchD_00147ea4_default:
          return;
        }
      }
      pbVar24 = local_120;
      if (!bVar40) {
        pbVar24 = local_120 + 1;
        *local_120 = bVar18;
      }
      iVar35 = ((uint)local_f8 + (uint)local_f8 * 4) * 2 + 0x10;
      if ((int)uVar12 < 0) {
        *pbVar24 = 0x30;
        pbVar24 = pbVar24 + 1;
        uVar12 = uVar12 + 1;
      }
      else {
        iVar28 = uVar12 + 1;
        do {
          if (iVar35 < 1) {
            bVar18 = 0x30;
          }
          else {
            dVar42 = ROUND(dVar1);
            iVar35 = iVar35 + -1;
            dVar1 = (dVar1 - (double)(int)dVar42) * 10.0;
            bVar18 = (char)(int)dVar42 + 0x30;
          }
          *pbVar24 = bVar18;
          pbVar24 = pbVar24 + 1;
          iVar28 = iVar28 + -1;
        } while (0 < iVar28);
        uVar12 = 0;
      }
      if ((bVar7 || local_f8 != 0) || 0 < iVar19) {
        *pbVar24 = 0x2e;
        pbVar24 = pbVar24 + 1;
      }
      iVar28 = iVar19;
      if ((int)uVar12 < 0) {
        memset(pbVar24,0x30,(ulong)~uVar12 + 1);
        pbVar24 = pbVar24 + (ulong)~uVar12 + 1;
        iVar28 = iVar19 + uVar12;
      }
      if (0 < iVar28) {
        uVar12 = ((int)uVar12 >> 0x1f & uVar12) + iVar19 + 1;
        do {
          if (iVar35 < 1) {
            bVar18 = 0x30;
          }
          else {
            dVar42 = ROUND(dVar1);
            iVar35 = iVar35 + -1;
            dVar1 = (dVar1 - (double)(int)dVar42) * 10.0;
            bVar18 = (char)(int)dVar42 + 0x30;
          }
          *pbVar24 = bVar18;
          pbVar24 = pbVar24 + 1;
          uVar12 = uVar12 - 1;
        } while (1 < uVar12);
      }
      if ((bool)(bVar41 & ((bVar7 || local_f8 != 0) || 0 < iVar19))) {
        while( true ) {
          pbVar27 = pbVar24 + -1;
          if (*pbVar27 != 0x30) break;
          *pbVar27 = 0;
          pbVar24 = pbVar27;
        }
        if (*pbVar27 == 0x2e) {
          if (local_f8 == 0) {
            *pbVar27 = 0;
            pbVar24 = pbVar27;
          }
          else {
            *pbVar24 = 0x30;
            pbVar24 = pbVar24 + 1;
          }
        }
      }
      if (bVar39) {
        *pbVar24 = "0123456789ABCDEF0123456789abcdef"[(byte)(&UNK_001a7d3f)[lVar23]];
        uVar12 = -uVar31;
        if (0 < (int)uVar31) {
          uVar12 = uVar31;
        }
        pbVar24[1] = (char)((int)uVar31 >> 0x1f) * -2 + 0x2b;
        if (uVar12 < 100) {
          pbVar24 = pbVar24 + 2;
        }
        else {
          pbVar24[2] = (char)(uVar12 / 100) + 0x30;
          pbVar24 = pbVar24 + 3;
          uVar12 = uVar12 % 100;
        }
        bVar18 = (byte)((uVar12 & 0xff) / 10);
        *pbVar24 = bVar18 | 0x30;
        pbVar24[1] = (char)uVar12 + bVar18 * -10 | 0x30;
        pbVar24 = pbVar24 + 2;
      }
      *pbVar24 = 0;
      uVar12 = (uint)pbVar24 - (int)local_120;
      uVar31 = uVar12;
      if (((bVar9) && (!bVar8)) && (uVar33 - uVar12 != 0 && (int)uVar12 <= (int)uVar33)) {
        if (-1 < (int)uVar12) {
          lVar23 = (long)(int)uVar33 + 1;
          lVar17 = (long)(int)uVar12;
          do {
            local_120[lVar23 + -1] = local_120[lVar17];
            lVar23 = lVar23 + -1;
            lVar17 = lVar17 + -1;
          } while ((int)(uVar33 - uVar12) < lVar23);
        }
        uVar31 = uVar33;
        if (uVar33 != uVar12) {
          memset(local_120 + uVar25,0x30,(ulong)(~(uint)pbVar24 + uVar33 + (int)local_120) + 1);
        }
      }
      goto LAB_00148d65;
    }
    uVar31 = 3;
    local_120 = (byte *)0x1aaafb;
    goto LAB_00148990;
  case '\x05':
    iVar19 = pAccum->nChar;
    uVar31 = ap->gp_offset;
    if ((ulong)uVar31 < 0x29) {
      puVar13 = (undefined8 *)((ulong)uVar31 + (long)ap->reg_save_area);
      ap->gp_offset = uVar31 + 8;
    }
    else {
      puVar13 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar13 + 1;
    }
    *(int *)*puVar13 = iVar19;
    goto LAB_00148bec;
  case '\x06':
  case '\a':
    uVar12 = ap->gp_offset;
    if ((ulong)uVar12 < 0x29) {
      puVar13 = (undefined8 *)((ulong)uVar12 + (long)ap->reg_save_area);
      ap->gp_offset = uVar12 + 8;
    }
    else {
      puVar13 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar13 + 1;
    }
    pbVar24 = (byte *)*puVar13;
    local_100 = (byte *)0x0;
    if (cVar2 == '\a') {
      local_100 = pbVar24;
    }
    local_120 = pbVar24;
    if (pbVar24 == (byte *)0x0) {
      local_120 = (byte *)0x1ad713;
      local_100 = pbVar24;
    }
    if ((int)uVar31 < 0) {
      lVar23 = 0;
      do {
        pbVar24 = local_120 + lVar23;
        lVar23 = lVar23 + 1;
      } while (*pbVar24 != 0);
      uVar31 = (int)lVar23 - 1U & 0x3fffffff;
      goto LAB_00148d65;
    }
    if (uVar31 != 0) {
      uVar14 = 0;
      do {
        if (local_120[uVar14] == 0) {
          uVar31 = (uint)uVar14;
          break;
        }
        uVar14 = uVar14 + 1;
      } while (uVar25 != uVar14);
      goto LAB_00148d65;
    }
    goto LAB_00148bf2;
  case '\b':
    local_78 = 0x25;
LAB_0014897f:
    uVar31 = 1;
    goto LAB_00148985;
  case '\t':
    uVar12 = ap->gp_offset;
    if ((ulong)uVar12 < 0x29) {
      pbVar24 = (byte *)((ulong)uVar12 + (long)ap->reg_save_area);
      ap->gp_offset = uVar12 + 8;
    }
    else {
      pbVar24 = (byte *)ap->overflow_arg_area;
      ap->overflow_arg_area = pbVar24 + 8;
    }
    local_78 = *pbVar24;
    if ((int)uVar31 < 0) goto LAB_0014897f;
    if (1 < uVar31) {
      memset(local_77,(uint)local_78,(ulong)(uVar31 - 1));
    }
LAB_00148985:
    local_120 = &local_78;
LAB_00148990:
    local_100 = (byte *)0x0;
    goto LAB_00148d65;
  case '\n':
  case '\v':
  case '\x0f':
    uVar12 = ap->gp_offset;
    if ((ulong)uVar12 < 0x29) {
      plVar21 = (long *)((ulong)uVar12 + (long)ap->reg_save_area);
      ap->gp_offset = uVar12 + 8;
    }
    else {
      plVar21 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = plVar21 + 1;
    }
    bVar18 = (cVar2 != '\x0f') * '\x05' + 0x22;
    pcVar4 = (char *)*plVar21;
    pcVar37 = "(NULL)";
    if (cVar2 == '\v') {
      pcVar37 = "NULL";
    }
    if (pcVar4 != (char *)0x0) {
      pcVar37 = pcVar4;
    }
    if (uVar31 == 0) {
      iVar19 = 0;
      uVar14 = 0;
    }
    else {
      uVar26 = 0;
      iVar19 = 0;
      do {
        uVar14 = uVar26;
        if (pcVar37[uVar26] == 0) break;
        iVar19 = iVar19 + (uint)(pcVar37[uVar26] == bVar18);
        uVar26 = uVar26 + 1;
        uVar14 = uVar25;
      } while (uVar31 != (uint)uVar26);
    }
    bVar39 = cVar2 == '\v';
    bVar40 = pcVar4 != (char *)0x0;
    uVar31 = iVar19 + (int)uVar14 + (uint)(bVar40 && bVar39) * 2 + 1;
    if (uVar31 < 0x47) {
      local_100 = (byte *)0x0;
      local_120 = &local_78;
    }
    else {
      local_120 = (byte *)sqlite3Malloc(uVar31);
      local_100 = local_120;
      if (local_120 == (byte *)0x0) goto LAB_00148e5f;
    }
    if (bVar40 && bVar39) {
      *local_120 = 0x27;
    }
    uVar31 = (uint)(bVar40 && bVar39);
    if ((int)uVar14 != 0) {
      uVar25 = 0;
      do {
        bVar3 = pcVar37[uVar25];
        local_120[(int)uVar31] = bVar3;
        uVar26 = (long)(int)uVar31 + 1;
        if (bVar3 == bVar18) {
          local_120[uVar26] = bVar18;
          uVar26 = (ulong)(uVar31 + 2);
        }
        uVar25 = uVar25 + 1;
        uVar31 = (uint)uVar26;
      } while ((uVar14 & 0xffffffff) != uVar25);
    }
    if (bVar40 && bVar39) {
      lVar23 = (long)(int)uVar31;
      uVar31 = uVar31 + 1;
      local_120[lVar23] = 0x27;
    }
    local_120[(int)uVar31] = 0;
    goto LAB_00148d65;
  case '\f':
    uVar31 = ap->gp_offset;
    if ((ulong)uVar31 < 0x29) {
      plVar21 = (long *)((ulong)uVar31 + (long)ap->reg_save_area);
      ap->gp_offset = uVar31 + 8;
    }
    else {
      plVar21 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = plVar21 + 1;
    }
    puVar13 = (undefined8 *)*plVar21;
    if (puVar13 != (undefined8 *)0x0) {
      sqlite3StrAccumAppend(pAccum,(char *)*puVar13,*(int *)(puVar13 + 1));
    }
LAB_00148bec:
    local_100 = (byte *)0x0;
    uVar33 = 0;
LAB_00148bf2:
    uVar31 = 0;
    goto LAB_00148d65;
  case '\r':
    uVar31 = ap->gp_offset;
    uVar25 = (ulong)uVar31;
    if (uVar25 < 0x29) {
      ap->gp_offset = (uint)(uVar25 + 8);
      lVar23 = *(long *)((long)ap->reg_save_area + uVar25);
      if (0x20 < uVar31) goto LAB_001488d0;
      piVar30 = (int *)(uVar25 + 8 + (long)ap->reg_save_area);
      ap->gp_offset = uVar31 + 0x10;
    }
    else {
      plVar21 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = plVar21 + 1;
      lVar23 = *plVar21;
LAB_001488d0:
      piVar30 = (int *)ap->overflow_arg_area;
      ap->overflow_arg_area = piVar30 + 2;
    }
    iVar19 = *piVar30;
    pcVar4 = *(char **)(lVar23 + 0x10 + (long)iVar19 * 0x68);
    if (pcVar4 != (char *)0x0) {
      sqlite3StrAccumAppend(pAccum,pcVar4,-1);
      sqlite3StrAccumAppend(pAccum,".",1);
    }
    sqlite3StrAccumAppend(pAccum,*(char **)(lVar23 + (long)iVar19 * 0x68 + 0x18),-1);
    uVar33 = 0;
    local_100 = (byte *)0x0;
    uVar31 = 0;
    goto LAB_00148d65;
  case '\x0e':
    if (((&UNK_001a7d3d)[lVar23] & 1) == 0) {
LAB_00148298:
      uVar12 = ap->gp_offset;
      if ((ulong)uVar12 < 0x29) {
        puVar16 = (ulong *)((ulong)uVar12 + (long)ap->reg_save_area);
        ap->gp_offset = uVar12 + 8;
      }
      else {
        puVar16 = (ulong *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar16 + 1;
      }
      uVar25 = *puVar16;
      goto LAB_001489a9;
    }
LAB_00148342:
    uVar12 = ap->gp_offset;
    if ((ulong)uVar12 < 0x29) {
      puVar16 = (ulong *)((ulong)uVar12 + (long)ap->reg_save_area);
      ap->gp_offset = uVar12 + 8;
    }
    else {
      puVar16 = (ulong *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar16 + 1;
    }
    uVar25 = *puVar16;
LAB_001489bc:
    if ((long)uVar25 < 0) {
      uVar25 = -uVar25;
      bVar18 = 0x2d;
    }
    else {
      bVar18 = 0x2b;
      if (!bVar39) {
        bVar18 = bVar40 << 5;
      }
    }
    break;
  default:
    goto switchD_00147ea4_default;
  }
  uVar12 = uVar31;
  if ((bVar9) && (uVar12 = (uVar33 - 1) + (uint)(bVar18 == 0), (int)uVar12 < (int)uVar31)) {
    uVar12 = uVar31;
  }
  if ((int)uVar12 < 0x3c) {
    iVar19 = 0x46;
    pbVar24 = &local_78;
    local_100 = (byte *)0x0;
  }
  else {
    iVar19 = uVar12 + 10;
    pbVar24 = (byte *)sqlite3Malloc(iVar19);
    local_100 = pbVar24;
    if (pbVar24 == (byte *)0x0) goto LAB_00148e5f;
  }
  pbVar36 = pbVar24 + (iVar19 - 1);
  pbVar27 = pbVar36;
  if (cVar2 == '\x10') {
    uVar14 = uVar25 % 10;
    if ((uVar25 / 10) % 10 == 1) {
      uVar14 = 0;
    }
    if (3 < uVar25 % 10) {
      uVar14 = 0;
    }
    pbVar27 = pbVar36 + -2;
    *(undefined2 *)(pbVar36 + -2) = *(undefined2 *)("thstndrd" + uVar14 * 2);
  }
  bVar3 = (&UNK_001a7d3f)[lVar23];
  uVar31 = 0x3c;
  if (0x3c < (int)uVar12) {
    uVar31 = uVar12;
  }
  uVar26 = (ulong)(byte)(&UNK_001a7d3c)[lVar23];
  iVar19 = (int)pbVar27 + uVar12;
  iVar35 = (iVar19 - uVar31) - (int)pbVar24;
  uVar12 = iVar35 - 10;
  lVar17 = 0;
  uVar14 = uVar25;
  do {
    pbVar27[lVar17 + -1] = "0123456789ABCDEF0123456789abcdef"[uVar14 % uVar26 + (ulong)bVar3];
    lVar17 = lVar17 + -1;
    uVar12 = uVar12 - 1;
    bVar39 = uVar26 <= uVar14;
    uVar14 = uVar14 / uVar26;
  } while (bVar39);
  if ((int)(((iVar19 - uVar31) - (int)pbVar24) + (int)lVar17 + -9) < 1) {
    local_120 = pbVar27 + lVar17;
  }
  else {
    local_120 = pbVar27 + (lVar17 - (ulong)uVar12) + -1;
    memset(local_120,0x30,(ulong)((iVar35 + (int)lVar17) - 10) + 1);
  }
  if (bVar18 != 0) {
    local_120[-1] = bVar18;
    local_120 = local_120 + -1;
  }
  if (bVar7 && uVar25 != 0) {
    bVar18 = (&fmtinfo[0].fmttype)[lVar23];
    if ((6 < bVar18) || ((0x49U >> (bVar18 & 0x1f) & 1) == 0)) {
      pbVar24 = (byte *)("-x0" + bVar18);
      bVar18 = *pbVar24;
      do {
        pbVar24 = pbVar24 + 1;
        local_120[-1] = bVar18;
        local_120 = local_120 + -1;
        bVar18 = *pbVar24;
      } while (bVar18 != 0);
    }
  }
  uVar31 = (int)pbVar36 - (int)local_120;
LAB_00148d65:
  if ((!bVar8) && (uVar33 - uVar31 != 0 && (int)uVar31 <= (int)uVar33)) {
    sqlite3AppendSpace(pAccum,uVar33 - uVar31);
  }
  if (0 < (int)uVar31) {
    sqlite3StrAccumAppend(pAccum,(char *)local_120,uVar31);
  }
  if ((bVar8) && (uVar33 - uVar31 != 0 && (int)uVar31 <= (int)uVar33)) {
    sqlite3AppendSpace(pAccum,uVar33 - uVar31);
  }
  sqlite3_free(local_100);
  fmt = (char *)(pbVar38 + 1);
  goto LAB_00147d61;
}

Assistant:

SQLITE_PRIVATE void sqlite3VXPrintf(
  StrAccum *pAccum,                  /* Accumulate results here */
  int useExtended,                   /* Allow extended %-conversions */
  const char *fmt,                   /* Format string */
  va_list ap                         /* arguments */
){
  int c;                     /* Next character in the format string */
  char *bufpt;               /* Pointer to the conversion buffer */
  int precision;             /* Precision of the current field */
  int length;                /* Length of the field */
  int idx;                   /* A general purpose loop counter */
  int width;                 /* Width of the current field */
  etByte flag_leftjustify;   /* True if "-" flag is present */
  etByte flag_plussign;      /* True if "+" flag is present */
  etByte flag_blanksign;     /* True if " " flag is present */
  etByte flag_alternateform; /* True if "#" flag is present */
  etByte flag_altform2;      /* True if "!" flag is present */
  etByte flag_zeropad;       /* True if field width constant starts with zero */
  etByte flag_long;          /* True if "l" flag is present */
  etByte flag_longlong;      /* True if the "ll" flag is present */
  etByte done;               /* Loop termination flag */
  etByte xtype = 0;          /* Conversion paradigm */
  char prefix;               /* Prefix character.  "+" or "-" or " " or '\0'. */
  sqlite_uint64 longvalue;   /* Value for integer types */
  LONGDOUBLE_TYPE realvalue; /* Value for real types */
  const et_info *infop;      /* Pointer to the appropriate info structure */
  char *zOut;                /* Rendering buffer */
  int nOut;                  /* Size of the rendering buffer */
  char *zExtra;              /* Malloced memory used by some conversion */
#ifndef SQLITE_OMIT_FLOATING_POINT
  int  exp, e2;              /* exponent of real numbers */
  int nsd;                   /* Number of significant digits returned */
  double rounder;            /* Used for rounding floating point values */
  etByte flag_dp;            /* True if decimal point should be shown */
  etByte flag_rtz;           /* True if trailing zeros should be removed */
#endif
  char buf[etBUFSIZE];       /* Conversion buffer */

  bufpt = 0;
  for(; (c=(*fmt))!=0; ++fmt){
    if( c!='%' ){
      int amt;
      bufpt = (char *)fmt;
      amt = 1;
      while( (c=(*++fmt))!='%' && c!=0 ) amt++;
      sqlite3StrAccumAppend(pAccum, bufpt, amt);
      if( c==0 ) break;
    }
    if( (c=(*++fmt))==0 ){
      sqlite3StrAccumAppend(pAccum, "%", 1);
      break;
    }
    /* Find out what flags are present */
    flag_leftjustify = flag_plussign = flag_blanksign = 
     flag_alternateform = flag_altform2 = flag_zeropad = 0;
    done = 0;
    do{
      switch( c ){
        case '-':   flag_leftjustify = 1;     break;
        case '+':   flag_plussign = 1;        break;
        case ' ':   flag_blanksign = 1;       break;
        case '#':   flag_alternateform = 1;   break;
        case '!':   flag_altform2 = 1;        break;
        case '0':   flag_zeropad = 1;         break;
        default:    done = 1;                 break;
      }
    }while( !done && (c=(*++fmt))!=0 );
    /* Get the field width */
    width = 0;
    if( c=='*' ){
      width = va_arg(ap,int);
      if( width<0 ){
        flag_leftjustify = 1;
        width = -width;
      }
      c = *++fmt;
    }else{
      while( c>='0' && c<='9' ){
        width = width*10 + c - '0';
        c = *++fmt;
      }
    }
    /* Get the precision */
    if( c=='.' ){
      precision = 0;
      c = *++fmt;
      if( c=='*' ){
        precision = va_arg(ap,int);
        if( precision<0 ) precision = -precision;
        c = *++fmt;
      }else{
        while( c>='0' && c<='9' ){
          precision = precision*10 + c - '0';
          c = *++fmt;
        }
      }
    }else{
      precision = -1;
    }
    /* Get the conversion type modifier */
    if( c=='l' ){
      flag_long = 1;
      c = *++fmt;
      if( c=='l' ){
        flag_longlong = 1;
        c = *++fmt;
      }else{
        flag_longlong = 0;
      }
    }else{
      flag_long = flag_longlong = 0;
    }
    /* Fetch the info entry for the field */
    infop = &fmtinfo[0];
    xtype = etINVALID;
    for(idx=0; idx<ArraySize(fmtinfo); idx++){
      if( c==fmtinfo[idx].fmttype ){
        infop = &fmtinfo[idx];
        if( useExtended || (infop->flags & FLAG_INTERN)==0 ){
          xtype = infop->type;
        }else{
          return;
        }
        break;
      }
    }
    zExtra = 0;

    /*
    ** At this point, variables are initialized as follows:
    **
    **   flag_alternateform          TRUE if a '#' is present.
    **   flag_altform2               TRUE if a '!' is present.
    **   flag_plussign               TRUE if a '+' is present.
    **   flag_leftjustify            TRUE if a '-' is present or if the
    **                               field width was negative.
    **   flag_zeropad                TRUE if the width began with 0.
    **   flag_long                   TRUE if the letter 'l' (ell) prefixed
    **                               the conversion character.
    **   flag_longlong               TRUE if the letter 'll' (ell ell) prefixed
    **                               the conversion character.
    **   flag_blanksign              TRUE if a ' ' is present.
    **   width                       The specified field width.  This is
    **                               always non-negative.  Zero is the default.
    **   precision                   The specified precision.  The default
    **                               is -1.
    **   xtype                       The class of the conversion.
    **   infop                       Pointer to the appropriate info struct.
    */
    switch( xtype ){
      case etPOINTER:
        flag_longlong = sizeof(char*)==sizeof(i64);
        flag_long = sizeof(char*)==sizeof(long int);
        /* Fall through into the next case */
      case etORDINAL:
      case etRADIX:
        if( infop->flags & FLAG_SIGNED ){
          i64 v;
          if( flag_longlong ){
            v = va_arg(ap,i64);
          }else if( flag_long ){
            v = va_arg(ap,long int);
          }else{
            v = va_arg(ap,int);
          }
          if( v<0 ){
            if( v==SMALLEST_INT64 ){
              longvalue = ((u64)1)<<63;
            }else{
              longvalue = -v;
            }
            prefix = '-';
          }else{
            longvalue = v;
            if( flag_plussign )        prefix = '+';
            else if( flag_blanksign )  prefix = ' ';
            else                       prefix = 0;
          }
        }else{
          if( flag_longlong ){
            longvalue = va_arg(ap,u64);
          }else if( flag_long ){
            longvalue = va_arg(ap,unsigned long int);
          }else{
            longvalue = va_arg(ap,unsigned int);
          }
          prefix = 0;
        }
        if( longvalue==0 ) flag_alternateform = 0;
        if( flag_zeropad && precision<width-(prefix!=0) ){
          precision = width-(prefix!=0);
        }
        if( precision<etBUFSIZE-10 ){
          nOut = etBUFSIZE;
          zOut = buf;
        }else{
          nOut = precision + 10;
          zOut = zExtra = sqlite3Malloc( nOut );
          if( zOut==0 ){
            pAccum->mallocFailed = 1;
            return;
          }
        }
        bufpt = &zOut[nOut-1];
        if( xtype==etORDINAL ){
          static const char zOrd[] = "thstndrd";
          int x = (int)(longvalue % 10);
          if( x>=4 || (longvalue/10)%10==1 ){
            x = 0;
          }
          *(--bufpt) = zOrd[x*2+1];
          *(--bufpt) = zOrd[x*2];
        }
        {
          register const char *cset;      /* Use registers for speed */
          register int base;
          cset = &aDigits[infop->charset];
          base = infop->base;
          do{                                           /* Convert to ascii */
            *(--bufpt) = cset[longvalue%base];
            longvalue = longvalue/base;
          }while( longvalue>0 );
        }
        length = (int)(&zOut[nOut-1]-bufpt);
        for(idx=precision-length; idx>0; idx--){
          *(--bufpt) = '0';                             /* Zero pad */
        }
        if( prefix ) *(--bufpt) = prefix;               /* Add sign */
        if( flag_alternateform && infop->prefix ){      /* Add "0" or "0x" */
          const char *pre;
          char x;
          pre = &aPrefix[infop->prefix];
          for(; (x=(*pre))!=0; pre++) *(--bufpt) = x;
        }
        length = (int)(&zOut[nOut-1]-bufpt);
        break;
      case etFLOAT:
      case etEXP:
      case etGENERIC:
        realvalue = va_arg(ap,double);
#ifdef SQLITE_OMIT_FLOATING_POINT
        length = 0;
#else
        if( precision<0 ) precision = 6;         /* Set default precision */
        if( realvalue<0.0 ){
          realvalue = -realvalue;
          prefix = '-';
        }else{
          if( flag_plussign )          prefix = '+';
          else if( flag_blanksign )    prefix = ' ';
          else                         prefix = 0;
        }
        if( xtype==etGENERIC && precision>0 ) precision--;
#if 0
        /* Rounding works like BSD when the constant 0.4999 is used.  Wierd! */
        for(idx=precision, rounder=0.4999; idx>0; idx--, rounder*=0.1);
#else
        /* It makes more sense to use 0.5 */
        for(idx=precision, rounder=0.5; idx>0; idx--, rounder*=0.1){}
#endif
        if( xtype==etFLOAT ) realvalue += rounder;
        /* Normalize realvalue to within 10.0 > realvalue >= 1.0 */
        exp = 0;
        if( sqlite3IsNaN((double)realvalue) ){
          bufpt = "NaN";
          length = 3;
          break;
        }
        if( realvalue>0.0 ){
          LONGDOUBLE_TYPE scale = 1.0;
          while( realvalue>=1e100*scale && exp<=350 ){ scale *= 1e100;exp+=100;}
          while( realvalue>=1e64*scale && exp<=350 ){ scale *= 1e64; exp+=64; }
          while( realvalue>=1e8*scale && exp<=350 ){ scale *= 1e8; exp+=8; }
          while( realvalue>=10.0*scale && exp<=350 ){ scale *= 10.0; exp++; }
          realvalue /= scale;
          while( realvalue<1e-8 ){ realvalue *= 1e8; exp-=8; }
          while( realvalue<1.0 ){ realvalue *= 10.0; exp--; }
          if( exp>350 ){
            if( prefix=='-' ){
              bufpt = "-Inf";
            }else if( prefix=='+' ){
              bufpt = "+Inf";
            }else{
              bufpt = "Inf";
            }
            length = sqlite3Strlen30(bufpt);
            break;
          }
        }
        bufpt = buf;
        /*
        ** If the field type is etGENERIC, then convert to either etEXP
        ** or etFLOAT, as appropriate.
        */
        if( xtype!=etFLOAT ){
          realvalue += rounder;
          if( realvalue>=10.0 ){ realvalue *= 0.1; exp++; }
        }
        if( xtype==etGENERIC ){
          flag_rtz = !flag_alternateform;
          if( exp<-4 || exp>precision ){
            xtype = etEXP;
          }else{
            precision = precision - exp;
            xtype = etFLOAT;
          }
        }else{
          flag_rtz = flag_altform2;
        }
        if( xtype==etEXP ){
          e2 = 0;
        }else{
          e2 = exp;
        }
        if( e2+precision+width > etBUFSIZE - 15 ){
          bufpt = zExtra = sqlite3Malloc( e2+precision+width+15 );
          if( bufpt==0 ){
            pAccum->mallocFailed = 1;
            return;
          }
        }
        zOut = bufpt;
        nsd = 16 + flag_altform2*10;
        flag_dp = (precision>0 ?1:0) | flag_alternateform | flag_altform2;
        /* The sign in front of the number */
        if( prefix ){
          *(bufpt++) = prefix;
        }
        /* Digits prior to the decimal point */
        if( e2<0 ){
          *(bufpt++) = '0';
        }else{
          for(; e2>=0; e2--){
            *(bufpt++) = et_getdigit(&realvalue,&nsd);
          }
        }
        /* The decimal point */
        if( flag_dp ){
          *(bufpt++) = '.';
        }
        /* "0" digits after the decimal point but before the first
        ** significant digit of the number */
        for(e2++; e2<0; precision--, e2++){
          assert( precision>0 );
          *(bufpt++) = '0';
        }
        /* Significant digits after the decimal point */
        while( (precision--)>0 ){
          *(bufpt++) = et_getdigit(&realvalue,&nsd);
        }
        /* Remove trailing zeros and the "." if no digits follow the "." */
        if( flag_rtz && flag_dp ){
          while( bufpt[-1]=='0' ) *(--bufpt) = 0;
          assert( bufpt>zOut );
          if( bufpt[-1]=='.' ){
            if( flag_altform2 ){
              *(bufpt++) = '0';
            }else{
              *(--bufpt) = 0;
            }
          }
        }
        /* Add the "eNNN" suffix */
        if( xtype==etEXP ){
          *(bufpt++) = aDigits[infop->charset];
          if( exp<0 ){
            *(bufpt++) = '-'; exp = -exp;
          }else{
            *(bufpt++) = '+';
          }
          if( exp>=100 ){
            *(bufpt++) = (char)((exp/100)+'0');        /* 100's digit */
            exp %= 100;
          }
          *(bufpt++) = (char)(exp/10+'0');             /* 10's digit */
          *(bufpt++) = (char)(exp%10+'0');             /* 1's digit */
        }
        *bufpt = 0;

        /* The converted number is in buf[] and zero terminated. Output it.
        ** Note that the number is in the usual order, not reversed as with
        ** integer conversions. */
        length = (int)(bufpt-zOut);
        bufpt = zOut;

        /* Special case:  Add leading zeros if the flag_zeropad flag is
        ** set and we are not left justified */
        if( flag_zeropad && !flag_leftjustify && length < width){
          int i;
          int nPad = width - length;
          for(i=width; i>=nPad; i--){
            bufpt[i] = bufpt[i-nPad];
          }
          i = prefix!=0;
          while( nPad-- ) bufpt[i++] = '0';
          length = width;
        }
#endif /* !defined(SQLITE_OMIT_FLOATING_POINT) */
        break;
      case etSIZE:
        *(va_arg(ap,int*)) = pAccum->nChar;
        length = width = 0;
        break;
      case etPERCENT:
        buf[0] = '%';
        bufpt = buf;
        length = 1;
        break;
      case etCHARX:
        c = va_arg(ap,int);
        buf[0] = (char)c;
        if( precision>=0 ){
          for(idx=1; idx<precision; idx++) buf[idx] = (char)c;
          length = precision;
        }else{
          length =1;
        }
        bufpt = buf;
        break;
      case etSTRING:
      case etDYNSTRING:
        bufpt = va_arg(ap,char*);
        if( bufpt==0 ){
          bufpt = "";
        }else if( xtype==etDYNSTRING ){
          zExtra = bufpt;
        }
        if( precision>=0 ){
          for(length=0; length<precision && bufpt[length]; length++){}
        }else{
          length = sqlite3Strlen30(bufpt);
        }
        break;
      case etSQLESCAPE:
      case etSQLESCAPE2:
      case etSQLESCAPE3: {
        int i, j, k, n, isnull;
        int needQuote;
        char ch;
        char q = ((xtype==etSQLESCAPE3)?'"':'\'');   /* Quote character */
        char *escarg = va_arg(ap,char*);
        isnull = escarg==0;
        if( isnull ) escarg = (xtype==etSQLESCAPE2 ? "NULL" : "(NULL)");
        k = precision;
        for(i=n=0; k!=0 && (ch=escarg[i])!=0; i++, k--){
          if( ch==q )  n++;
        }
        needQuote = !isnull && xtype==etSQLESCAPE2;
        n += i + 1 + needQuote*2;
        if( n>etBUFSIZE ){
          bufpt = zExtra = sqlite3Malloc( n );
          if( bufpt==0 ){
            pAccum->mallocFailed = 1;
            return;
          }
        }else{
          bufpt = buf;
        }
        j = 0;
        if( needQuote ) bufpt[j++] = q;
        k = i;
        for(i=0; i<k; i++){
          bufpt[j++] = ch = escarg[i];
          if( ch==q ) bufpt[j++] = ch;
        }
        if( needQuote ) bufpt[j++] = q;
        bufpt[j] = 0;
        length = j;
        /* The precision in %q and %Q means how many input characters to
        ** consume, not the length of the output...
        ** if( precision>=0 && precision<length ) length = precision; */
        break;
      }
      case etTOKEN: {
        Token *pToken = va_arg(ap, Token*);
        if( pToken ){
          sqlite3StrAccumAppend(pAccum, (const char*)pToken->z, pToken->n);
        }
        length = width = 0;
        break;
      }
      case etSRCLIST: {
        SrcList *pSrc = va_arg(ap, SrcList*);
        int k = va_arg(ap, int);
        struct SrcList_item *pItem = &pSrc->a[k];
        assert( k>=0 && k<pSrc->nSrc );
        if( pItem->zDatabase ){
          sqlite3StrAccumAppend(pAccum, pItem->zDatabase, -1);
          sqlite3StrAccumAppend(pAccum, ".", 1);
        }
        sqlite3StrAccumAppend(pAccum, pItem->zName, -1);
        length = width = 0;
        break;
      }
      default: {
        assert( xtype==etINVALID );
        return;
      }
    }/* End switch over the format type */
    /*
    ** The text of the conversion is pointed to by "bufpt" and is
    ** "length" characters long.  The field width is "width".  Do
    ** the output.
    */
    if( !flag_leftjustify ){
      register int nspace;
      nspace = width-length;
      if( nspace>0 ){
        sqlite3AppendSpace(pAccum, nspace);
      }
    }
    if( length>0 ){
      sqlite3StrAccumAppend(pAccum, bufpt, length);
    }
    if( flag_leftjustify ){
      register int nspace;
      nspace = width-length;
      if( nspace>0 ){
        sqlite3AppendSpace(pAccum, nspace);
      }
    }
    sqlite3_free(zExtra);
  }/* End for loop over the format string */
}